

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

char * __thiscall QMetaProperty::typeName(QMetaProperty *this)

{
  uint typeId;
  QMetaObject *pQVar1;
  uint *puVar2;
  uint *puVar3;
  QMetaTypeInterface *pQVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QMetaType local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->mobj;
  if (pQVar1 != (QMetaObject *)0x0) {
    puVar2 = (pQVar1->d).data;
    puVar3 = (this->data).d;
    pQVar4 = (pQVar1->d).metaTypes
             [(ulong)((int)((ulong)((long)puVar3 - (long)puVar2) >> 2) - puVar2[7]) / 5];
    if (pQVar4 != (QMetaTypeInterface *)0x0) {
      pcVar5 = pQVar4->name;
      goto LAB_00283cbe;
    }
    typeId = puVar3[1];
    if ((int)typeId < 0) {
      puVar2 = (pQVar1->d).stringdata;
      pcVar5 = (char *)((ulong)puVar2[(int)(typeId * 2)] + (long)puVar2);
      goto LAB_00283cbe;
    }
    QMetaType::QMetaType(&local_18,typeId);
    if (local_18.d_ptr != (QMetaTypeInterface *)0x0) {
      pcVar5 = (local_18.d_ptr)->name;
      goto LAB_00283cbe;
    }
  }
  pcVar5 = (char *)0x0;
LAB_00283cbe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pcVar5;
  }
  __stack_chk_fail();
}

Assistant:

const char *QMetaProperty::typeName() const
{
    if (!mobj)
        return nullptr;
    // TODO: can the metatype be invalid for dynamic metaobjects?
    if (const auto mt = metaType(); mt.isValid())
        return mt.name();
    return typeNameFromTypeInfo(mobj, data.type()).constData();
}